

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

FeatureType __thiscall
CoreML::FeatureType::Array
          (FeatureType *this,vector<long,_std::allocator<long>_> *shape,MLArrayDataType dataType)

{
  bool bVar1;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  reference plVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FeatureType FVar3;
  int64_t s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  ArrayFeatureType *params;
  MLArrayDataType dataType_local;
  vector<long,_std::allocator<long>_> *shape_local;
  FeatureType *out;
  
  FeatureType(this,MLFeatureTypeType_multiArrayType);
  this_00 = operator->(this);
  this_01 = Specification::FeatureType::mutable_multiarraytype(this_00);
  __end1 = std::vector<long,_std::allocator<long>_>::begin(shape);
  s = (int64_t)std::vector<long,_std::allocator<long>_>::end(shape);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                     *)&s), bVar1) {
    plVar2 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end1);
    Specification::ArrayFeatureType::add_shape(this_01,*plVar2);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&__end1);
  }
  Specification::ArrayFeatureType::set_datatype(this_01,dataType);
  FVar3.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  FVar3.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (FeatureType)
         FVar3.m_type.
         super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FeatureType FeatureType::Array(const std::vector<int64_t> shape, MLArrayDataType dataType) {
        FeatureType out(MLFeatureTypeType_multiArrayType);
        Specification::ArrayFeatureType *params = out->mutable_multiarraytype();
        
        for (int64_t s : shape) {
            params->add_shape(s);
        }
        params->set_datatype(static_cast<Specification::ArrayFeatureType::ArrayDataType>(dataType));
        return out;
    }